

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall
QFutureInterfaceBasePrivate::disconnectOutputInterface
          (QFutureInterfaceBasePrivate *this,QFutureCallOutInterface *iface)

{
  long lVar1;
  qsizetype qVar2;
  long *in_RSI;
  QMutexLocker<QMutex> *in_RDI;
  long in_FS_OFFSET;
  qsizetype index;
  QMutexLocker<QMutex> lock;
  QMutex *in_stack_ffffffffffffffa8;
  QFutureCallOutInterface **in_stack_ffffffffffffffb8;
  QListSpecialMethodsBase<QFutureCallOutInterface_*> *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker(in_RDI,in_stack_ffffffffffffffa8);
  qVar2 = QListSpecialMethodsBase<QFutureCallOutInterface*>::indexOf<QFutureCallOutInterface*>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(qsizetype)in_RDI);
  if (qVar2 != -1) {
    QList<QFutureCallOutInterface_*>::removeAt
              ((QList<QFutureCallOutInterface_*> *)in_RDI,(qsizetype)in_stack_ffffffffffffffa8);
    (**(code **)(*in_RSI + 0x18))();
  }
  QMutexLocker<QMutex>::~QMutexLocker(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBasePrivate::disconnectOutputInterface(QFutureCallOutInterface *iface)
{
    QMutexLocker lock(&m_mutex);
    const qsizetype index = outputConnections.indexOf(iface);
    if (index == -1)
        return;
    outputConnections.removeAt(index);

    iface->callOutInterfaceDisconnected();
}